

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key,Symbol **value)

{
  Type *pTVar1;
  undefined8 *puVar2;
  char16_t *pcVar3;
  Type pHVar4;
  Type piVar5;
  code *pcVar6;
  char cVar7;
  bool bVar8;
  hash_t hVar9;
  hash_t hVar10;
  int iVar11;
  undefined4 *puVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long *plVar16;
  uint uVar17;
  int iVar18;
  CharacterBuffer<char16_t> local_60;
  long local_50;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *local_48;
  uint local_3c;
  hash_t local_38;
  hash_t local_34;
  
  lVar13 = *(long *)this;
  if (lVar13 == 0) {
    BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar13 = *(long *)this;
  }
  hVar9 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)key);
  local_38 = hVar9 * 2 + 1;
  local_34 = PrimePolicy::ModPrime(hVar9 & 0x7fffffff,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar13 + (ulong)local_34 * 4);
  if ((int)uVar14 < 0) {
    cVar7 = (char)(uVar14 >> 0x18);
    uVar17 = 0;
  }
  else {
    local_50 = *(long *)(this + 8);
    uVar17 = 0;
    local_48 = (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                *)this;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar13 = local_50;
    do {
      lVar15 = (ulong)uVar14 * 0x10;
      puVar2 = *(undefined8 **)(lVar13 + lVar15);
      pcVar3 = (char16_t *)*puVar2;
      local_3c = uVar17;
      Memory::Recycler::WBSetBit((char *)&local_60);
      local_60.string.ptr = pcVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
      local_60.len = *(Type *)(puVar2 + 1);
      hVar10 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_60);
      if (hVar10 * 2 + 1 != *(int *)(lVar13 + 0xc + lVar15)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar8) goto LAB_008b02a0;
        *puVar12 = 0;
      }
      plVar16 = (long *)(lVar15 + local_50);
      if (*(hash_t *)((long)plVar16 + 0xc) == local_38) {
        puVar2 = (undefined8 *)*plVar16;
        pcVar3 = (char16_t *)*puVar2;
        Memory::Recycler::WBSetBit((char *)&local_60);
        local_60.string.ptr = pcVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
        local_60.len = *(Type *)(puVar2 + 1);
        bVar8 = CharacterBuffer<char16_t>::operator==(&local_60,key);
        if (bVar8) {
          if (local_48->stats == (DictionaryStats *)0x0) {
            return -1;
          }
          DictionaryStats::Lookup(local_48->stats,local_3c);
          return -1;
        }
      }
      uVar17 = local_3c + 1;
      uVar14 = *(uint *)(plVar16 + 1);
    } while (-1 < (int)uVar14);
    cVar7 = (char)(uVar14 >> 0x18);
    this = (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
            *)local_48;
  }
  if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
        *)this)->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup
              (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                 *)this)->stats,uVar17);
  }
  hVar10 = local_34;
  iVar18 = -1;
  if (cVar7 < '\0') {
    if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
          *)this)->freeCount == 0) {
      iVar18 = ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                 *)this)->count;
      if (iVar18 == ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                      *)this)->size) {
        BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                  *)this);
        hVar10 = PrimePolicy::ModPrime
                           (hVar9 & 0x7fffffff,
                            ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                              *)this)->bucketCount,
                            ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                              *)this)->modFunctionIndex);
        iVar18 = ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                   *)this)->count;
      }
      ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
        *)this)->count = iVar18 + 1;
      if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->size < iVar18 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar8) goto LAB_008b02a0;
        *puVar12 = 0;
      }
      if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->size <= iVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar8) goto LAB_008b02a0;
        *puVar12 = 0;
      }
    }
    else {
      if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar8) goto LAB_008b02a0;
        *puVar12 = 0;
      }
      if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar8) goto LAB_008b02a0;
        *puVar12 = 0;
      }
      if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->count <=
          ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
            *)this)->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar8) {
LAB_008b02a0:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar12 = 0;
      }
      iVar18 = ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                 *)this)->freeList;
      pTVar1 = &((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                  *)this)->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar11 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex
                           (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                              *)this)->entries + iVar18);
        ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
          *)this)->freeList = iVar11;
      }
    }
    pHVar4 = ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
               *)this)->entries;
    *(Symbol **)
     &pHVar4[iVar18].
      super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
         = *value;
    pHVar4[iVar18].
    super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .hashCode = local_38;
    piVar5 = ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
               *)this)->buckets;
    *(int *)&pHVar4[iVar18].
             super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
             .field_0x8 = piVar5[hVar10];
    piVar5[hVar10] = iVar18;
    uVar17 = 0;
    iVar11 = iVar18;
    do {
      iVar11 = *(int *)&pHVar4[iVar11].
                        super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                        .field_0x8;
      uVar17 = uVar17 + 1;
    } while (iVar11 != -1);
    if (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
          *)this)->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert
                (((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                   *)this)->stats,uVar17);
    }
  }
  return iVar18;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }